

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

void do_cmd_retrieve(command *cmd)

{
  byte bVar1;
  _Bool _Var2;
  wchar_t wVar3;
  store *s;
  object *dest;
  object *dest_00;
  wchar_t amt;
  object *obj;
  object *picked_item;
  wchar_t local_3c;
  object *local_38;
  object *local_30;
  
  s = store_at((chunk_conflict2 *)cave,player->grid);
  if (s != (store *)0x0) {
    if (s->sidx != store_home_idx) {
      msg("You are not currently at home.");
      return;
    }
    wVar3 = cmd_get_arg_item((command_conflict *)cmd,"item",&local_38);
    if (wVar3 == L'\0') {
      _Var2 = pile_contains(s->stock,local_38);
      if (_Var2) {
        wVar3 = cmd_get_arg_number((command_conflict *)cmd,"quantity",&local_3c);
        if (wVar3 == L'\0') {
          dest = object_new();
          local_30 = dest;
          object_copy_amt(dest,local_38,local_3c);
          bVar1 = dest->number;
          wVar3 = inven_carry_num(player,dest);
          if (wVar3 < (int)(uint)bVar1) {
            msg("You cannot carry that many items.");
            object_delete((chunk *)0x0,(chunk *)0x0,&local_30);
          }
          else {
            distribute_charges(local_38,dest,local_3c);
            dest_00 = object_new();
            object_copy(dest_00,local_38->known);
            dest->known = dest_00;
            inven_carry(player,dest,true,true);
            handle_stuff(player);
            store_delete(s,local_38,local_3c);
            event_signal(EVENT_STORECHANGED);
            event_signal(EVENT_INVENTORY);
            event_signal(EVENT_EQUIPMENT);
          }
        }
      }
      else {
        msg("You cannot retrieve that item because it\'s not in the home.");
      }
    }
  }
  return;
}

Assistant:

void do_cmd_retrieve(struct command *cmd)
{
	int amt;

	struct object *obj, *known_obj, *picked_item;

	struct store *store = store_at(cave, player->grid);
	if (!store) return;

	if (!store_is_home(store)) {
		msg("You are not currently at home.");
		return;
	}

	/* Get arguments */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK)
		return;

	if (!pile_contains(store->stock, obj)) {
		msg("You cannot retrieve that item because it's not in the home.");
		return;
	}

	if (cmd_get_arg_number(cmd, "quantity", &amt) != CMD_OK)
		return;

	/* Get desired object */
	picked_item = object_new();
	object_copy_amt(picked_item, obj, amt);

	/* Ensure we have room */
	if (picked_item->number > inven_carry_num(player, picked_item)) {
		msg("You cannot carry that many items.");
		object_delete(NULL, NULL, &picked_item);
		return;
	}

	/* Distribute charges of wands, staves, or rods */
	distribute_charges(obj, picked_item, amt);

	/* Make a known object */
	known_obj = object_new();
	object_copy(known_obj, obj->known);
	picked_item->known = known_obj;

	/* Give it to the player */
	inven_carry(player, picked_item, true, true);

	/* Handle stuff */
	handle_stuff(player);
	
	/* Reduce or remove the item */
	store_delete(store, obj, amt);

	event_signal(EVENT_STORECHANGED);
	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}